

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathRunStreamEval
              (xmlXPathContextPtr ctxt,xmlPatternPtr comp,xmlXPathObjectPtr *resultSeq,int toBool)

{
  xmlElementType xVar1;
  xmlGenericErrorFunc p_Var2;
  int iVar3;
  int iVar4;
  xmlXPathObjectPtr pxVar5;
  xmlStreamCtxtPtr streamCtxt;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  xmlChar *local_90;
  xmlStreamCtxtPtr patstream;
  xmlNodePtr limit;
  xmlNodePtr cur;
  int local_40;
  int eval_all_nodes;
  int depth;
  int ret;
  int from_root;
  int min_depth;
  int max_depth;
  int toBool_local;
  xmlXPathObjectPtr *resultSeq_local;
  xmlPatternPtr comp_local;
  xmlXPathContextPtr ctxt_local;
  
  limit = (xmlNodePtr)0x0;
  patstream = (xmlStreamCtxtPtr)0x0;
  if ((ctxt == (xmlXPathContextPtr)0x0) || (comp == (xmlPatternPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    from_root = xmlPatternMaxDepth(comp);
    if (from_root == -1) {
      ctxt_local._4_4_ = -1;
    }
    else {
      if (from_root == -2) {
        from_root = 10000;
      }
      iVar3 = xmlPatternMinDepth(comp);
      if (iVar3 == -1) {
        ctxt_local._4_4_ = -1;
      }
      else {
        iVar4 = xmlPatternFromRoot(comp);
        if (iVar4 < 0) {
          ctxt_local._4_4_ = -1;
        }
        else {
          if (toBool == 0) {
            if (resultSeq == (xmlXPathObjectPtr *)0x0) {
              return -1;
            }
            pxVar5 = xmlXPathCacheNewNodeSet(ctxt,(xmlNodePtr)0x0);
            *resultSeq = pxVar5;
            if (*resultSeq == (xmlXPathObjectPtr)0x0) {
              return -1;
            }
          }
          if (iVar3 == 0) {
            if (iVar4 == 0) {
              if (toBool != 0) {
                return 1;
              }
              xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,ctxt->node);
            }
            else {
              if (toBool != 0) {
                return 1;
              }
              xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)ctxt->doc);
            }
          }
          if (from_root == 0) {
            ctxt_local._4_4_ = 0;
          }
          else {
            if (iVar4 == 0) {
              patstream = (xmlStreamCtxtPtr)limit;
              if ((ctxt->node != (xmlNodePtr)0x0) &&
                 ((xVar1 = ctxt->node->type, xVar1 == XML_ELEMENT_NODE ||
                  ((6 < xVar1 - XML_ATTRIBUTE_NODE &&
                   ((xVar1 == XML_DOCUMENT_NODE ||
                    ((xVar1 != XML_DOCUMENT_TYPE_NODE &&
                     ((xVar1 == XML_DOCUMENT_FRAG_NODE ||
                      ((xVar1 != XML_NOTATION_NODE && (xVar1 == XML_HTML_DOCUMENT_NODE))))))))))))))
              {
                patstream = (xmlStreamCtxtPtr)ctxt->node;
                limit = (xmlNodePtr)patstream;
              }
            }
            else {
              limit = (xmlNodePtr)ctxt->doc;
            }
            if (limit == (xmlNodePtr)0x0) {
              ctxt_local._4_4_ = 0;
            }
            else {
              streamCtxt = xmlPatternGetStreamCtxt(comp);
              if (streamCtxt == (xmlStreamCtxtPtr)0x0) {
                ctxt_local._4_4_ = 0;
              }
              else {
                iVar3 = xmlStreamWantsAnyNode(streamCtxt);
                if (((iVar4 != 0) &&
                    (iVar4 = xmlStreamPush(streamCtxt,(xmlChar *)0x0,(xmlChar *)0x0), -1 < iVar4))
                   && (iVar4 == 1)) {
                  if (toBool != 0) {
LAB_0025e56f:
                    if (streamCtxt != (xmlStreamCtxtPtr)0x0) {
                      xmlFreeStreamCtxt(streamCtxt);
                    }
                    return 1;
                  }
                  xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,limit);
                }
                local_40 = 0;
LAB_0025e3dc:
                if (limit->type != XML_NAMESPACE_DECL) {
                  if (((limit->children != (_xmlNode *)0x0) && (local_40 < from_root)) &&
                     (limit->children->type != XML_ENTITY_DECL)) {
                    limit = limit->children;
                    local_40 = local_40 + 1;
                    if (limit->type == XML_DTD_NODE) goto LAB_0025e434;
                    goto LAB_0025e52a;
                  }
LAB_0025e434:
                  if (limit != (xmlNodePtr)patstream) {
                    do {
                      if (limit->next == (_xmlNode *)0x0) goto LAB_0025e479;
                      limit = limit->next;
                    } while ((limit->type == XML_ENTITY_DECL) || (limit->type == XML_DTD_NODE));
                    goto LAB_0025e203;
                  }
                }
LAB_0025e556:
                if (streamCtxt != (xmlStreamCtxtPtr)0x0) {
                  xmlFreeStreamCtxt(streamCtxt);
                }
                ctxt_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return ctxt_local._4_4_;
  while (limit != (_xmlNode *)0x0) {
LAB_0025e479:
    limit = limit->parent;
    local_40 = local_40 + -1;
    if (((limit == (_xmlNode *)0x0) || (limit == (xmlNodePtr)patstream)) || (limit->type == 9))
    goto LAB_0025e556;
    if (limit->type == 1) {
      xmlStreamPop(streamCtxt);
    }
    else if ((iVar3 != 0) &&
            ((((limit->type == 3 || (limit->type == 4)) || (limit->type == 8)) || (limit->type == 7)
             ))) {
      xmlStreamPop(streamCtxt);
    }
    if (limit->next != (_xmlNode *)0x0) {
      limit = limit->next;
      break;
    }
  }
LAB_0025e52a:
  if (limit == (xmlNodePtr)0x0 || local_40 < 0) goto LAB_0025e556;
LAB_0025e203:
  while( true ) {
    if (ctxt->opLimit != 0) {
      if (ctxt->opLimit <= ctxt->opCount) {
        pp_Var6 = __xmlGenericError();
        p_Var2 = *pp_Var6;
        ppvVar7 = __xmlGenericErrorContext();
        (*p_Var2)(*ppvVar7,"XPath operation limit exceeded\n");
        xmlFreeStreamCtxt(streamCtxt);
        return -1;
      }
      ctxt->opCount = ctxt->opCount + 1;
    }
    xVar1 = limit->type;
    if (((xVar1 != XML_ELEMENT_NODE) && (1 < xVar1 - XML_TEXT_NODE)) &&
       (xVar1 != XML_PI_NODE && xVar1 != XML_COMMENT_NODE)) break;
    if (limit->type == XML_ELEMENT_NODE) {
      if (limit->ns == (xmlNs *)0x0) {
        local_90 = (xmlChar *)0x0;
      }
      else {
        local_90 = limit->ns->href;
      }
      eval_all_nodes = xmlStreamPush(streamCtxt,limit->name,local_90);
    }
    else {
      if (iVar3 == 0) break;
      eval_all_nodes = xmlStreamPushNode(streamCtxt,(xmlChar *)0x0,(xmlChar *)0x0,limit->type);
    }
    if ((-1 < eval_all_nodes) && (eval_all_nodes == 1)) {
      if (toBool != 0) goto LAB_0025e56f;
      iVar4 = xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,limit);
      if (iVar4 < 0) {
        (ctxt->lastError).domain = 0xc;
        (ctxt->lastError).code = 2;
      }
    }
    if ((limit->children != (_xmlNode *)0x0) && (local_40 < from_root)) break;
    xmlStreamPop(streamCtxt);
    do {
      if (limit->next == (_xmlNode *)0x0) goto LAB_0025e3dc;
      limit = limit->next;
    } while ((limit->type == XML_ENTITY_DECL) || (limit->type == XML_DTD_NODE));
  }
  goto LAB_0025e3dc;
}

Assistant:

static int
xmlXPathRunStreamEval(xmlXPathContextPtr ctxt, xmlPatternPtr comp,
		      xmlXPathObjectPtr *resultSeq, int toBool)
{
    int max_depth, min_depth;
    int from_root;
    int ret, depth;
    int eval_all_nodes;
    xmlNodePtr cur = NULL, limit = NULL;
    xmlStreamCtxtPtr patstream = NULL;

    if ((ctxt == NULL) || (comp == NULL))
        return(-1);
    max_depth = xmlPatternMaxDepth(comp);
    if (max_depth == -1)
        return(-1);
    if (max_depth == -2)
        max_depth = 10000;
    min_depth = xmlPatternMinDepth(comp);
    if (min_depth == -1)
        return(-1);
    from_root = xmlPatternFromRoot(comp);
    if (from_root < 0)
        return(-1);
#if 0
    printf("stream eval: depth %d from root %d\n", max_depth, from_root);
#endif

    if (! toBool) {
	if (resultSeq == NULL)
	    return(-1);
	*resultSeq = xmlXPathCacheNewNodeSet(ctxt, NULL);
	if (*resultSeq == NULL)
	    return(-1);
    }

    /*
     * handle the special cases of "/" amd "." being matched
     */
    if (min_depth == 0) {
	if (from_root) {
	    /* Select "/" */
	    if (toBool)
		return(1);
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,
		                     (xmlNodePtr) ctxt->doc);
	} else {
	    /* Select "self::node()" */
	    if (toBool)
		return(1);
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, ctxt->node);
	}
    }
    if (max_depth == 0) {
	return(0);
    }

    if (from_root) {
        cur = (xmlNodePtr)ctxt->doc;
    } else if (ctxt->node != NULL) {
        switch (ctxt->node->type) {
            case XML_ELEMENT_NODE:
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
	        cur = ctxt->node;
		break;
            case XML_ATTRIBUTE_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
            case XML_NOTATION_NODE:
            case XML_DTD_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_ELEMENT_DECL:
            case XML_ATTRIBUTE_DECL:
            case XML_ENTITY_DECL:
            case XML_NAMESPACE_DECL:
            case XML_XINCLUDE_START:
            case XML_XINCLUDE_END:
		break;
	}
	limit = cur;
    }
    if (cur == NULL) {
        return(0);
    }

    patstream = xmlPatternGetStreamCtxt(comp);
    if (patstream == NULL) {
	/*
	* QUESTION TODO: Is this an error?
	*/
	return(0);
    }

    eval_all_nodes = xmlStreamWantsAnyNode(patstream);

    if (from_root) {
	ret = xmlStreamPush(patstream, NULL, NULL);
	if (ret < 0) {
	} else if (ret == 1) {
	    if (toBool)
		goto return_1;
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, cur);
	}
    }
    depth = 0;
    goto scan_children;
next_node:
    do {
        if (ctxt->opLimit != 0) {
            if (ctxt->opCount >= ctxt->opLimit) {
                xmlGenericError(xmlGenericErrorContext,
                        "XPath operation limit exceeded\n");
                xmlFreeStreamCtxt(patstream);
                return(-1);
            }
            ctxt->opCount++;
        }

	switch (cur->type) {
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
		if (cur->type == XML_ELEMENT_NODE) {
		    ret = xmlStreamPush(patstream, cur->name,
				(cur->ns ? cur->ns->href : NULL));
		} else if (eval_all_nodes)
		    ret = xmlStreamPushNode(patstream, NULL, NULL, cur->type);
		else
		    break;

		if (ret < 0) {
		    /* NOP. */
		} else if (ret == 1) {
		    if (toBool)
			goto return_1;
		    if (xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, cur)
		        < 0) {
			ctxt->lastError.domain = XML_FROM_XPATH;
			ctxt->lastError.code = XML_ERR_NO_MEMORY;
		    }
		}
		if ((cur->children == NULL) || (depth >= max_depth)) {
		    ret = xmlStreamPop(patstream);
		    while (cur->next != NULL) {
			cur = cur->next;
			if ((cur->type != XML_ENTITY_DECL) &&
			    (cur->type != XML_DTD_NODE))
			    goto next_node;
		    }
		}
	    default:
		break;
	}

scan_children:
	if (cur->type == XML_NAMESPACE_DECL) break;
	if ((cur->children != NULL) && (depth < max_depth)) {
	    /*
	     * Do not descend on entities declarations
	     */
	    if (cur->children->type != XML_ENTITY_DECL) {
		cur = cur->children;
		depth++;
		/*
		 * Skip DTDs
		 */
		if (cur->type != XML_DTD_NODE)
		    continue;
	    }
	}

	if (cur == limit)
	    break;

	while (cur->next != NULL) {
	    cur = cur->next;
	    if ((cur->type != XML_ENTITY_DECL) &&
		(cur->type != XML_DTD_NODE))
		goto next_node;
	}

	do {
	    cur = cur->parent;
	    depth--;
	    if ((cur == NULL) || (cur == limit) ||
                (cur->type == XML_DOCUMENT_NODE))
	        goto done;
	    if (cur->type == XML_ELEMENT_NODE) {
		ret = xmlStreamPop(patstream);
	    } else if ((eval_all_nodes) &&
		((cur->type == XML_TEXT_NODE) ||
		 (cur->type == XML_CDATA_SECTION_NODE) ||
		 (cur->type == XML_COMMENT_NODE) ||
		 (cur->type == XML_PI_NODE)))
	    {
		ret = xmlStreamPop(patstream);
	    }
	    if (cur->next != NULL) {
		cur = cur->next;
		break;
	    }
	} while (cur != NULL);

    } while ((cur != NULL) && (depth >= 0));

done:

    if (patstream)
	xmlFreeStreamCtxt(patstream);
    return(0);

return_1:
    if (patstream)
	xmlFreeStreamCtxt(patstream);
    return(1);
}